

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void doctest::anon_unknown_14::reportFatal(string *message)

{
  bool bVar1;
  size_type sVar2;
  reference ppIVar3;
  IReporter **curr_rep_3;
  iterator __end2_2;
  iterator __begin2_2;
  vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *__range2_2;
  IReporter **curr_rep_2;
  iterator __end2_1;
  iterator __begin2_1;
  vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *__range2_1;
  IReporter **curr_rep_1;
  iterator __end3;
  iterator __begin3;
  vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *__range3;
  IReporter **curr_rep;
  iterator __end2;
  iterator __begin2;
  vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *__range2;
  vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *in_stack_ffffffffffffff38;
  __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
  *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  String *in_stack_ffffffffffffff50;
  __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
  local_a8;
  long local_a0;
  reference local_98;
  IReporter **local_90;
  __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
  local_88;
  ContextState *in_stack_ffffffffffffff80;
  __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
  local_68;
  long local_60;
  __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
  local_48 [3];
  undefined1 local_30;
  reference local_28;
  IReporter **local_20;
  __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
  local_18;
  long local_10;
  
  *(uint *)(detail::g_cs + 0xb0) = *(uint *)(detail::g_cs + 0xb0) | 4;
  local_10 = detail::g_cs + 0x10d0;
  local_18._M_current =
       (IReporter **)
       std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::begin
                 (in_stack_ffffffffffffff38);
  local_20 = (IReporter **)
             std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::end
                       (in_stack_ffffffffffffff38);
  while (bVar1 = __gnu_cxx::operator!=
                           (in_stack_ffffffffffffff40,
                            (__normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                             *)in_stack_ffffffffffffff38), bVar1) {
    local_28 = __gnu_cxx::
               __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
               ::operator*(&local_18);
    in_stack_ffffffffffffff38 =
         (vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *)*local_28;
    std::__cxx11::string::c_str();
    in_stack_ffffffffffffff40 = local_48;
    String::String(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    local_30 = 1;
    (*(code *)(in_stack_ffffffffffffff38->
              super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>).
              _M_impl.super__Vector_impl_data._M_start[6])
              (in_stack_ffffffffffffff38,in_stack_ffffffffffffff40);
    TestCaseException::~TestCaseException((TestCaseException *)0x116e17);
    __gnu_cxx::
    __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
    ::operator++(&local_18);
  }
  while (sVar2 = std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                 ::size((vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                         *)(detail::g_cs + 0x1110)), sVar2 != 0) {
    std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>::pop_back
              ((vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_> *)
               0x116e81);
    local_60 = detail::g_cs + 0x10d0;
    local_68._M_current =
         (IReporter **)
         std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::begin
                   (in_stack_ffffffffffffff38);
    std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::end
              (in_stack_ffffffffffffff38);
    while (bVar1 = __gnu_cxx::operator!=
                             (in_stack_ffffffffffffff40,
                              (__normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                               *)in_stack_ffffffffffffff38), bVar1) {
      ppIVar3 = __gnu_cxx::
                __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                ::operator*(&local_68);
      (*(*ppIVar3)->_vptr_IReporter[8])();
      __gnu_cxx::
      __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
      ::operator++(&local_68);
    }
  }
  detail::ContextState::finalizeTestCaseData(in_stack_ffffffffffffff80);
  local_88._M_current =
       (IReporter **)
       std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::begin
                 (in_stack_ffffffffffffff38);
  local_90 = (IReporter **)
             std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::end
                       (in_stack_ffffffffffffff38);
  while (bVar1 = __gnu_cxx::operator!=
                           (in_stack_ffffffffffffff40,
                            (__normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                             *)in_stack_ffffffffffffff38), bVar1) {
    local_98 = __gnu_cxx::
               __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
               ::operator*(&local_88);
    (*(*local_98)->_vptr_IReporter[5])(*local_98,detail::g_cs + 0xa0);
    __gnu_cxx::
    __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
    ::operator++(&local_88);
  }
  local_a0 = detail::g_cs + 0x10d0;
  local_a8._M_current =
       (IReporter **)
       std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::begin
                 (in_stack_ffffffffffffff38);
  std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::end
            (in_stack_ffffffffffffff38);
  while (bVar1 = __gnu_cxx::operator!=
                           (in_stack_ffffffffffffff40,
                            (__normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                             *)in_stack_ffffffffffffff38), bVar1) {
    ppIVar3 = __gnu_cxx::
              __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
              ::operator*(&local_a8);
    (*(*ppIVar3)->_vptr_IReporter[2])(*ppIVar3,detail::g_cs + 0x88);
    __gnu_cxx::
    __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
    ::operator++(&local_a8);
  }
  return;
}

Assistant:

void reportFatal(const std::string& message) {
        g_cs->failure_flags |= TestCaseFailureReason::Crash;

        DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_exception, {message.c_str(), true});

        while(g_cs->subcasesStack.size()) {
            g_cs->subcasesStack.pop_back();
            DOCTEST_ITERATE_THROUGH_REPORTERS(subcase_end, DOCTEST_EMPTY);
        }

        g_cs->finalizeTestCaseData();

        DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_end, *g_cs);

        DOCTEST_ITERATE_THROUGH_REPORTERS(test_run_end, *g_cs);
    }